

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.cpp
# Opt level: O0

vector<mjs::string,_std::allocator<mjs::string>_> * __thiscall
mjs::object::enumerable_property_names
          (vector<mjs::string,_std::allocator<mjs::string>_> *__return_storage_ptr__,object *this)

{
  bool bVar1;
  gc_heap *h;
  object *poVar2;
  object *this_local;
  vector<mjs::string,_std::allocator<mjs::string>_> *names;
  
  std::vector<mjs::string,_std::allocator<mjs::string>_>::vector(__return_storage_ptr__);
  (*this->_vptr_object[7])(this,__return_storage_ptr__,1);
  bVar1 = mjs::gc_heap_ptr_untracked::operator_cast_to_bool
                    ((gc_heap_ptr_untracked *)&this->prototype_);
  if (bVar1) {
    h = heap(this);
    poVar2 = gc_heap_ptr_untracked<mjs::object,_true>::dereference(&this->prototype_,h);
    (*poVar2->_vptr_object[7])(poVar2,__return_storage_ptr__,1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<string> object::enumerable_property_names() const {
    std::vector<string> names;
    add_own_property_names(names, true);
    if (prototype_) {
        prototype_.dereference(heap()).add_own_property_names(names, true);
    }
    return names;
}